

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QModelIndex,QPersistentModelIndex>>::
emplace<QModelIndex_const&,QModelIndex&>
          (QMovableArrayOps<std::pair<QModelIndex,QPersistentModelIndex>> *this,qsizetype i,
          QModelIndex *args,QModelIndex *args_1)

{
  undefined8 *puVar1;
  long lVar2;
  quintptr qVar3;
  QPersistentModelIndex QVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  Inserter local_80;
  undefined8 local_58;
  quintptr qStack_50;
  QAbstractItemModel *local_48;
  QPersistentModelIndex local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int **)this != (int *)0x0) && (**(int **)this < 2)) {
    if (*(long *)(this + 0x10) == i) {
      qVar5 = QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::freeSpaceAtEnd
                        ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)this);
      if (qVar5 == 0) goto LAB_0042eace;
      puVar1 = (undefined8 *)(*(long *)(this + 8) + *(long *)(this + 0x10) * 0x20);
      puVar1[2] = (args->m).ptr;
      qVar3 = args->i;
      *puVar1 = *(undefined8 *)args;
      puVar1[1] = qVar3;
      QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)(puVar1 + 3),args_1);
LAB_0042ec08:
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      goto LAB_0042ebb2;
    }
LAB_0042eace:
    if (i == 0) {
      qVar5 = QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::freeSpaceAtBegin
                        ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)this);
      if (qVar5 != 0) {
        lVar2 = *(long *)(this + 8);
        *(QAbstractItemModel **)(lVar2 + -0x10) = (args->m).ptr;
        qVar3 = args->i;
        *(undefined8 *)(lVar2 + -0x20) = *(undefined8 *)args;
        *(quintptr *)(lVar2 + -0x18) = qVar3;
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)(lVar2 + -8),args_1);
        *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
        goto LAB_0042ec08;
      }
    }
  }
  local_40.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_4_ = args->r;
  local_58._4_4_ = args->c;
  qStack_50 = args->i;
  local_48 = (args->m).ptr;
  QPersistentModelIndex::QPersistentModelIndex(&local_40,args_1);
  lVar2 = *(long *)(this + 0x10);
  QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)this,
             (uint)(i == 0 && lVar2 != 0),1,(pair<QModelIndex,_QPersistentModelIndex> **)0x0,
             (QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)0x0);
  QVar4.d = local_40.d;
  if (i == 0 && lVar2 != 0) {
    lVar2 = *(long *)(this + 8);
    *(QAbstractItemModel **)(lVar2 + -0x10) = local_48;
    *(undefined8 *)(lVar2 + -0x20) = local_58;
    *(quintptr *)(lVar2 + -0x18) = qStack_50;
    local_40.d = (QPersistentModelIndexData *)0x0;
    *(QPersistentModelIndexData **)(lVar2 + -8) = QVar4.d;
    *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  else {
    QMovableArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_>::Inserter::Inserter
              (&local_80,(QArrayDataPointer<std::pair<QModelIndex,_QPersistentModelIndex>_> *)this,i
               ,1);
    QVar4.d = local_40.d;
    ((local_80.displaceFrom)->first).m.ptr = local_48;
    ((local_80.displaceFrom)->first).r = (undefined4)local_58;
    ((local_80.displaceFrom)->first).c = local_58._4_4_;
    ((local_80.displaceFrom)->first).i = qStack_50;
    local_40.d = (QPersistentModelIndexData *)0x0;
    ((local_80.displaceFrom)->second).d = QVar4.d;
    local_80.displaceFrom = local_80.displaceFrom + 1;
    QMovableArrayOps<std::pair<QModelIndex,_QPersistentModelIndex>_>::Inserter::~Inserter(&local_80)
    ;
  }
  QPersistentModelIndex::~QPersistentModelIndex(&local_40);
LAB_0042ebb2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }